

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_varname(GREG *G)

{
  int iVar1;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *cclass;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = G->pos;
  iVar3 = G->thunkpos;
  iVar1 = yymatchClass(G,(uchar *)"",in_RDX);
  if (iVar1 != 0) {
    iVar4 = G->pos;
    iVar3 = G->thunkpos;
    pcVar2 = extraout_RDX;
    do {
      iVar1 = yymatchClass(G,(uchar *)"",pcVar2);
      pcVar2 = extraout_RDX_00;
      if (iVar1 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar1 = yymatchChar(G,0x2d);
        if ((iVar1 == 0) ||
           (iVar1 = yymatchClass(G,(uchar *)"",cclass), pcVar2 = extraout_RDX_02, iVar1 == 0))
        goto LAB_001097b1;
        do {
          iVar4 = G->pos;
          iVar3 = G->thunkpos;
          iVar1 = yymatchClass(G,(uchar *)"",pcVar2);
          pcVar2 = extraout_RDX_03;
        } while (iVar1 != 0);
      }
      else {
        do {
          iVar4 = G->pos;
          iVar3 = G->thunkpos;
          iVar1 = yymatchClass(G,(uchar *)"",pcVar2);
          pcVar2 = extraout_RDX_01;
        } while (iVar1 != 0);
      }
      G->pos = iVar4;
      G->thunkpos = iVar3;
    } while( true );
  }
  iVar1 = 0;
LAB_001097b8:
  G->pos = iVar4;
  G->thunkpos = iVar3;
  return iVar1;
LAB_001097b1:
  iVar1 = 1;
  goto LAB_001097b8;
}

Assistant:

YY_RULE(int) yy_varname(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "varname"));
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l197;

  l198:;	
  {  int yypos199= G->pos, yythunkpos199= G->thunkpos;
  {  int yypos200= G->pos, yythunkpos200= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l201;

  l202:;	
  {  int yypos203= G->pos, yythunkpos203= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l203;
  goto l202;
  l203:;	  G->pos= yypos203; G->thunkpos= yythunkpos203;
  }  goto l200;
  l201:;	  G->pos= yypos200; G->thunkpos= yythunkpos200;  if (!yymatchChar(G, '-')) goto l199;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l199;

  l204:;	
  {  int yypos205= G->pos, yythunkpos205= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l205;
  goto l204;
  l205:;	  G->pos= yypos205; G->thunkpos= yythunkpos205;
  }
  }
  l200:;	  goto l198;
  l199:;	  G->pos= yypos199; G->thunkpos= yythunkpos199;
  }  yyprintf((stderr, "  ok   varname"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l197:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "varname"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}